

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t helper_macmuls_m68k(CPUM68KState_conflict *env,uint32_t op1,uint32_t op2)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  uVar3 = (ulong)op2 * (ulong)op1;
  uVar2 = (long)(uVar3 * 0x1000000) >> 0x18;
  if ((uVar2 != uVar3) && (uVar1 = env->macsr, env->macsr = uVar1 | 2, (char)uVar1 < '\0')) {
    uVar2 = (long)uVar3 >> 0x3f ^ 0x4000000000000;
  }
  return uVar2;
}

Assistant:

uint64_t HELPER(macmuls)(CPUM68KState *env, uint32_t op1, uint32_t op2)
{
    int64_t product;
    int64_t res;

    product = (uint64_t)op1 * op2;
    res = (product << 24) >> 24;
    if (res != product) {
        env->macsr |= MACSR_V;
        if (env->macsr & MACSR_OMC) {
            /* Make sure the accumulate operation overflows.  */
            if (product < 0)
                res = ~(1ll << 50);
            else
                res = 1ll << 50;
        }
    }
    return res;
}